

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFSCharter.cpp
# Opt level: O0

bool __thiscall FSCConnection::InitCurl(FSCConnection *this)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  LTError *pLVar5;
  long in_RDI;
  char chBuf [2048];
  LTOnlineChannel *in_stack_fffffffffffff7b8;
  char local_818 [176];
  bool local_1;
  
  bVar1 = LTOnlineChannel::InitCurl(in_stack_fffffffffffff7b8);
  if (bVar1) {
    if (*(long *)(in_RDI + 0x210) != 0) {
      curl_slist_free_all(*(undefined8 *)(in_RDI + 0x210));
    }
    *(undefined8 *)(in_RDI + 0x210) = 0;
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        uVar3 = std::__cxx11::string::c_str();
        uVar4 = std::__cxx11::string::c_str();
        snprintf(local_818,0x800,"Authorization: %s %s",uVar3,uVar4);
        uVar3 = curl_slist_append(*(undefined8 *)(in_RDI + 0x210),local_818);
        *(undefined8 *)(in_RDI + 0x210) = uVar3;
      }
    }
    uVar3 = curl_slist_append(*(undefined8 *)(in_RDI + 0x210),"Content-Type: application/json");
    *(undefined8 *)(in_RDI + 0x210) = uVar3;
    if (*(long *)(in_RDI + 0x210) == 0) {
      pLVar5 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(pLVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFSCharter.cpp"
                       ,0x89,"InitCurl",logFATAL,"ASSERT FAILED: %s","pCurlHeader");
      __cxa_throw(pLVar5,&LTError::typeinfo,LTError::~LTError);
    }
    uVar3 = curl_slist_append(*(undefined8 *)(in_RDI + 0x210),"Accept: application/json");
    *(undefined8 *)(in_RDI + 0x210) = uVar3;
    if (*(long *)(in_RDI + 0x98) == 0) {
      pLVar5 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(pLVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFSCharter.cpp"
                       ,0x8d,"InitCurl",logFATAL,"ASSERT FAILED: %s","pCurl");
      __cxa_throw(pLVar5,&LTError::typeinfo,LTError::~LTError);
    }
    curl_easy_setopt(*(undefined8 *)(in_RDI + 0x98),0x2727,*(undefined8 *)(in_RDI + 0x210));
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FSCConnection::InitCurl ()
{
    // Standard-init first (repeated call will just return true without effect)
    if (!LTOnlineChannel::InitCurl())
        return false;
    
    // if there is a header already remove it first
    if (pCurlHeader)
        curl_slist_free_all(pCurlHeader);
    pCurlHeader = nullptr;
    
    // if we have a token then we add it to the header
    if ( !token.empty() && !token_type.empty() ) {
        char chBuf[2048];
        snprintf(chBuf, sizeof(chBuf), FSC_HEADER_AUTHORIZATION,
                 token_type.c_str(),
                 token.c_str());
        pCurlHeader = curl_slist_append(pCurlHeader, chBuf);
    }
    
    // we always need to say that we send/receive JSON format
    pCurlHeader = curl_slist_append(pCurlHeader, FSC_HEADER_JSON_SEND);
    LOG_ASSERT(pCurlHeader);
    pCurlHeader = curl_slist_append(pCurlHeader, FSC_HEADER_JSON_ACCEPT);
    
    // set the header
    LOG_ASSERT(pCurl);
    curl_easy_setopt(pCurl, CURLOPT_HTTPHEADER, pCurlHeader);
    return true;
}